

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.h
# Opt level: O3

bool wabt::operator==(OpcodeInfo *lhs,OpcodeInfo *rhs)

{
  pointer __s1;
  pointer puVar1;
  pointer __s2;
  int iVar2;
  size_t __n;
  
  if (((lhs->opcode_).enum_ == (rhs->opcode_).enum_) && (lhs->kind_ == rhs->kind_)) {
    __s1 = (lhs->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    puVar1 = (lhs->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)puVar1 - (long)__s1;
    __s2 = (rhs->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    if (__n == (long)(rhs->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)__s2) {
      if (puVar1 != __s1) {
        iVar2 = bcmp(__s1,__s2,__n);
        return iVar2 == 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

operator Enum() const { return enum_; }